

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O2

string_view __thiscall google::protobuf::internal::MicroString::Get(MicroString *this)

{
  MicroRep *pMVar1;
  ulong uVar2;
  LargeRep *pLVar3;
  string_view sVar4;
  
  if (((ulong)this->rep_ & 2) == 0) {
    if (((ulong)this->rep_ & 1) == 0) {
      sVar4 = inline_view(this);
      return sVar4;
    }
    pLVar3 = large_rep(this);
    pMVar1 = (MicroRep *)pLVar3->payload;
    uVar2 = (ulong)pLVar3->size;
  }
  else {
    pMVar1 = micro_rep(this);
    uVar2 = (ulong)pMVar1->size;
    pMVar1 = pMVar1 + 1;
  }
  sVar4._M_str = (char *)pMVar1;
  sVar4._M_len = uVar2;
  return sVar4;
}

Assistant:

absl::string_view Get() const {
    if (is_micro_rep()) {
      return micro_rep()->view();
    } else if (is_inline()) {
      return inline_view();
    } else {
      return large_rep()->view();
    }
  }